

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  bool bVar1;
  CppType CVar2;
  int iVar3;
  Descriptor *pDVar4;
  Reflection *this;
  FieldDescriptor *pFVar5;
  MessageOptions *this_00;
  reference ppFVar6;
  FieldDescriptor *this_01;
  MapFieldBase *this_02;
  MapValueConstRef *this_03;
  MessageLite *pMVar7;
  int local_15c;
  int j;
  int size;
  MapIterator end;
  MapIterator iter;
  MapFieldBase *map_field;
  FieldDescriptor *value_field;
  FieldDescriptor *field;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  iterator local_68;
  undefined8 local_60;
  undefined1 local_48 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  int i;
  int field_count;
  Reflection *reflection;
  Descriptor *descriptor;
  Message *message_local;
  
  pDVar4 = Message::GetDescriptor(message);
  this = GetReflectionOrDie(message);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Descriptor::field_count(pDVar4);
  for (fields.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage <
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    pFVar5 = Descriptor::field(pDVar4,(int)fields.
                                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = FieldDescriptor::is_required(pFVar5);
    if (bVar1) {
      pFVar5 = Descriptor::field(pDVar4,(int)fields.
                                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = Reflection::HasField(this,message,pFVar5);
      if (!bVar1) {
        message_local._7_1_ = 0;
        goto LAB_0055825a;
      }
    }
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_48);
  this_00 = Descriptor::options(pDVar4);
  bVar1 = MessageOptions::map_entry(this_00);
  if (bVar1) {
    __range2 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)Descriptor::map_value(pDVar4);
    local_68 = (iterator)&__range2;
    local_60 = 1;
    __l._M_len = 1;
    __l._M_array = local_68;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::operator=((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_48,__l);
  }
  else {
    Reflection::ListFields
              (this,message,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)local_48);
  }
  __end2 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_48);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_48);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&field);
    if (!bVar1) {
      message_local._7_1_ = 1;
LAB_00558244:
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_48);
LAB_0055825a:
      return (bool)(message_local._7_1_ & 1);
    }
    ppFVar6 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end2);
    pFVar5 = *ppFVar6;
    CVar2 = FieldDescriptor::cpp_type(pFVar5);
    if (CVar2 == CPPTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_map(pFVar5);
      if (bVar1) {
        pDVar4 = FieldDescriptor::message_type(pFVar5);
        this_01 = Descriptor::field(pDVar4,1);
        CVar2 = FieldDescriptor::cpp_type(this_01);
        if (CVar2 == CPPTYPE_MESSAGE) {
          this_02 = Reflection::GetMapData(this,message,pFVar5);
          bVar1 = MapFieldBase::IsMapValid(this_02);
          if (!bVar1) goto LAB_00558103;
          MapIterator::MapIterator
                    ((MapIterator *)&end.value_.super_MapValueConstRef.type_,message,pFVar5);
          MapIterator::MapIterator((MapIterator *)&size,message,pFVar5);
          MapFieldBase::MapBegin(this_02,(MapIterator *)&end.value_.super_MapValueConstRef.type_);
          MapFieldBase::MapEnd(this_02,(MapIterator *)&size);
          while (bVar1 = protobuf::operator!=
                                   ((MapIterator *)&end.value_.super_MapValueConstRef.type_,
                                    (MapIterator *)&size), bVar1) {
            this_03 = &MapIterator::GetValueRef
                                 ((MapIterator *)&end.value_.super_MapValueConstRef.type_)->
                       super_MapValueConstRef;
            pMVar7 = &MapValueConstRef::GetMessageValue(this_03)->super_MessageLite;
            bVar1 = MessageLite::IsInitialized(pMVar7);
            if (!bVar1) {
              message_local._7_1_ = 0;
              j = 1;
              goto LAB_005580bd;
            }
            MapIterator::operator++((MapIterator *)&end.value_.super_MapValueConstRef.type_);
          }
          j = 6;
LAB_005580bd:
          MapIterator::~MapIterator((MapIterator *)&size);
          MapIterator::~MapIterator((MapIterator *)&end.value_.super_MapValueConstRef.type_);
          if (j != 6) goto LAB_00558244;
        }
      }
      else {
LAB_00558103:
        bVar1 = FieldDescriptor::is_repeated(pFVar5);
        if (bVar1) {
          iVar3 = Reflection::FieldSize(this,message,pFVar5);
          for (local_15c = 0; local_15c < iVar3; local_15c = local_15c + 1) {
            pMVar7 = &Reflection::GetRepeatedMessage(this,message,pFVar5,local_15c)->
                      super_MessageLite;
            bVar1 = MessageLite::IsInitialized(pMVar7);
            if (!bVar1) {
              message_local._7_1_ = 0;
              goto LAB_00558244;
            }
          }
        }
        else {
          pMVar7 = &Reflection::GetMessage(this,message,pFVar5,(MessageFactory *)0x0)->
                    super_MessageLite;
          bVar1 = MessageLite::IsInitialized(pMVar7);
          if (!bVar1) {
            message_local._7_1_ = 0;
            goto LAB_00558244;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  {
    const int field_count = descriptor->field_count();
    for (int i = 0; i < field_count; i++) {
      if (descriptor->field(i)->is_required()) {
        if (!reflection->HasField(message, descriptor->field(i))) {
          return false;
        }
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  // Should be safe to skip stripped fields because required fields are not
  // stripped.
  if (descriptor->options().map_entry()) {
    // MapEntry objects always check the value regardless of has bit.
    // We don't need to bother with the key.
    fields = {descriptor->map_value()};
  } else {
    reflection->ListFields(message, &fields);
  }
  for (const FieldDescriptor* field : fields) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const MapFieldBase* map_field =
              reflection->GetMapData(message, field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                   .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}